

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void ypr_text_squote_line(lys_ypr_ctx *pctx,char *text,int text_len)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  pcVar2 = text + text_len;
  pcVar5 = text;
  if (text_len != 0) {
    iVar8 = (int)text;
    do {
      pcVar3 = ly_strnchr(text,0x27,(long)pcVar2 - (long)text);
      pcVar5 = text;
      if (pcVar3 == (char *)0x0) goto LAB_0018ea27;
      ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar3 - (int)text),text);
      uVar6 = (text_len + iVar8) - (int)pcVar3;
      lVar1 = 0;
      pcVar5 = pcVar3;
      do {
        lVar4 = lVar1;
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == pcVar2) goto LAB_0018e9e6;
        lVar1 = lVar4 + -1;
      } while (*pcVar5 == '\'');
      uVar6 = -(int)lVar1;
LAB_0018e9e6:
      uVar7 = 0;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar7 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"\' + \"%.*s\" +\n%*s\'",(ulong)uVar6,pcVar3,uVar7,"");
      text = pcVar5;
    } while (pcVar5 != pcVar2);
    text = pcVar3 + (1 - lVar4);
  }
LAB_0018ea27:
  ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar2 - (int)text),pcVar5);
  return;
}

Assistant:

static void
ypr_text_squote_line(struct lys_ypr_ctx *pctx, const char *text, int text_len)
{
    const char *end = text + text_len, *squote;
    int squote_len;

    while ((text != end) && (squote = ly_strnchr(text, '\'', end - text))) {
        /* before squote */
        ly_print_(pctx->out, "%.*s", (int)(squote - text), text);

        /* specially-encoded squote(s) */
        squote_len = 0;
        do {
            ++squote_len;
        } while ((squote + squote_len != end) && (squote[squote_len] == '\''));
        ly_print_(pctx->out, "' + \"%.*s\" +\n%*s'", squote_len, squote, INDENT);

        /* next iter */
        text = squote + squote_len;
    }

    ly_print_(pctx->out, "%.*s", (int)(end - text), text);
}